

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

int nni_sock_shutdown(nni_sock *sock)

{
  int iVar1;
  nni_listener *l_00;
  nni_dialer *d_00;
  nni_ctx *pnVar2;
  void *pvVar3;
  nni_ctx *local_40;
  nni_ctx *nctx;
  nni_ctx *ctx;
  nni_listener *l;
  nni_dialer *d;
  nni_pipe *pipe;
  nni_sock *sock_local;
  
  nni_mtx_lock(&sock->s_mx);
  if ((sock->s_closing & 1U) == 0) {
    sock->s_closing = true;
    while (l_00 = (nni_listener *)nni_list_first(&sock->s_listeners), l_00 != (nni_listener *)0x0) {
      nni_listener_hold(l_00);
      nni_mtx_unlock(&sock->s_mx);
      nni_listener_close(l_00);
      nni_mtx_lock(&sock->s_mx);
    }
    while (d_00 = (nni_dialer *)nni_list_first(&sock->s_dialers), d_00 != (nni_dialer *)0x0) {
      nni_dialer_hold(d_00);
      nni_mtx_unlock(&sock->s_mx);
      nni_dialer_close(d_00);
      nni_mtx_lock(&sock->s_mx);
    }
    for (d = (nni_dialer *)nni_list_first(&sock->s_pipes); d != (nni_dialer *)0x0;
        d = (nni_dialer *)nni_list_next(&sock->s_pipes,d)) {
      nni_pipe_close((nni_pipe *)d);
    }
    nni_mtx_unlock(&sock->s_mx);
    nni_msgq_close(sock->s_urq);
    nni_msgq_close(sock->s_uwq);
    nni_mtx_lock(&sock_lk);
    pnVar2 = (nni_ctx *)nni_list_first(&sock->s_ctxs);
    while (local_40 = pnVar2, local_40 != (nni_ctx *)0x0) {
      pnVar2 = (nni_ctx *)nni_list_next(&sock->s_ctxs,local_40);
      local_40->c_closed = true;
      if (local_40->c_ref == 0) {
        nni_id_remove(&ctx_ids,(ulong)local_40->c_id);
        nni_list_remove(&sock->s_ctxs,local_40);
        nni_ctx_destroy(local_40);
      }
    }
    while (iVar1 = nni_list_empty(&sock->s_ctxs), iVar1 == 0) {
      nni_cv_wait(&sock->s_close_cv);
    }
    nni_mtx_unlock(&sock_lk);
    nni_mtx_lock(&sock->s_mx);
    while (iVar1 = nni_list_empty(&sock->s_pipes), iVar1 == 0) {
      nni_cv_wait(&sock->s_cv);
    }
    pvVar3 = nni_list_first(&sock->s_pipes);
    if (pvVar3 != (void *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
                0x2b6,"nni_list_first(&sock->s_pipes) == NULL");
    }
    nni_mtx_unlock(&sock->s_mx);
    (*(sock->s_sock_ops).sock_close)(sock->s_data);
    sock_local._4_4_ = 0;
  }
  else {
    nni_mtx_unlock(&sock->s_mx);
    sock_local._4_4_ = 7;
  }
  return sock_local._4_4_;
}

Assistant:

int
nni_sock_shutdown(nni_sock *sock)
{
	nni_pipe     *pipe;
	nni_dialer   *d;
	nni_listener *l;
	nni_ctx      *ctx;
	nni_ctx      *nctx;

	nni_mtx_lock(&sock->s_mx);
	if (sock->s_closing) {
		nni_mtx_unlock(&sock->s_mx);
		return (NNG_ECLOSED);
	}
	// Mark us closing, so no more EPs or changes can occur.
	sock->s_closing = true;

	while ((l = nni_list_first(&sock->s_listeners)) != NULL) {
		nni_listener_hold(l);
		nni_mtx_unlock(&sock->s_mx);
		nni_listener_close(l);
		nni_mtx_lock(&sock->s_mx);
	}

	while ((d = nni_list_first(&sock->s_dialers)) != NULL) {
		nni_dialer_hold(d);
		nni_mtx_unlock(&sock->s_mx);
		nni_dialer_close(d);
		nni_mtx_lock(&sock->s_mx);
	}

	// For each pipe, arrange for it to teardown hard.  We would
	// expect there not to be any here.
	NNI_LIST_FOREACH (&sock->s_pipes, pipe) {
		nni_pipe_close(pipe);
	}

	nni_mtx_unlock(&sock->s_mx);

	// Close the upper queues immediately.
	nni_msgq_close(sock->s_urq);
	nni_msgq_close(sock->s_uwq);

	// We now mark any owned contexts as closing.
	// XXX: Add context draining support here!
	nni_mtx_lock(&sock_lk);
	nctx = nni_list_first(&sock->s_ctxs);
	while ((ctx = nctx) != NULL) {
		nctx          = nni_list_next(&sock->s_ctxs, ctx);
		ctx->c_closed = true;
		if (ctx->c_ref == 0) {
			// No open operations.  So close it.
			nni_id_remove(&ctx_ids, ctx->c_id);
			nni_list_remove(&sock->s_ctxs, ctx);
			nni_ctx_destroy(ctx);
		}
		// If still has a reference count, then wait for last
		// reference to close before nuking it.
	}

	// Generally, unless the protocol is blocked trying to perform
	// writes (e.g. a slow reader on the other side), it should be
	// trying to shut things down.  We wait to give it
	// a chance to do so gracefully.

	while (!nni_list_empty(&sock->s_ctxs)) {
		nni_cv_wait(&sock->s_close_cv);
	}
	nni_mtx_unlock(&sock_lk);

	nni_mtx_lock(&sock->s_mx);
	// We have to wait for pipes to be removed.
	while (!nni_list_empty(&sock->s_pipes)) {
		nni_cv_wait(&sock->s_cv);
	}
	NNI_ASSERT(nni_list_first(&sock->s_pipes) == NULL);
	nni_mtx_unlock(&sock->s_mx);

	sock->s_sock_ops.sock_close(sock->s_data);

	// At this point, there are no threads blocked inside of us
	// that are referencing socket state.  User code should call
	// nng_socket_close to release the last resources.
	return (0);
}